

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__ptr;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int blocklen;
  uint s2;
  uint s1;
  int d_1;
  int e;
  int d;
  int n;
  uchar **hlist;
  uchar *bestloc;
  int best;
  int h;
  uchar ***hash_table;
  uchar *out;
  int bitcount;
  int j;
  int i;
  uint bitbuf;
  uint *in_stack_ffffffffffffff68;
  uchar **in_stack_ffffffffffffff70;
  int local_7c;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long local_50;
  uint local_48;
  uchar *local_38;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int *local_18;
  int local_c;
  long local_8;
  
  local_20 = 0;
  local_2c = 0;
  local_38 = (uchar *)0x0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  __ptr = malloc(0x20000);
  if (local_1c < 5) {
    local_1c = 5;
  }
  if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
    stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  iVar5 = *(int *)(local_38 + -4);
  *(int *)(local_38 + -4) = iVar5 + 1;
  local_38[iVar5] = 'x';
  if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
    stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  iVar5 = *(int *)(local_38 + -4);
  *(int *)(local_38 + -4) = iVar5 + 1;
  local_38[iVar5] = '^';
  local_20 = 1 << ((byte)local_2c & 0x1f) | local_20;
  local_2c = local_2c + 1;
  local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                (int *)0x1387e7);
  local_20 = 1 << ((byte)local_2c & 0x1f) | local_20;
  local_2c = local_2c + 2;
  local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                (int *)0x13881e);
  for (local_24 = 0; local_24 < 0x4000; local_24 = local_24 + 1) {
    *(undefined8 *)((long)__ptr + (long)local_24 * 8) = 0;
  }
  local_24 = 0;
  do {
    if (local_c + -3 <= local_24) {
      for (; local_24 < local_c; local_24 = local_24 + 1) {
        if (*(byte *)(local_8 + local_24) < 0x90) {
          iVar5 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x30,8);
          local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 8;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                                        ,(int *)0x139090);
        }
        else {
          iVar5 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x100,9);
          local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 9;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                                        ,(int *)0x1390eb);
        }
      }
      iVar5 = stbiw__zlib_bitrev(0,7);
      local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
      local_2c = local_2c + 7;
      local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                    (int *)0x139139);
      while (local_2c != 0) {
        local_20 = 0 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 1;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x139174);
      }
      for (local_24 = 0; local_24 < 0x4000; local_24 = local_24 + 1) {
        if (*(long *)((long)__ptr + (long)local_24 * 8) != 0) {
          free((void *)(*(long *)((long)__ptr + (long)local_24 * 8) + -8));
        }
      }
      free(__ptr);
      uVar3 = 1;
      uVar4 = 0;
      local_28 = 0;
      iVar5 = local_c % 0x15b0;
      while (local_28 < local_c) {
        for (local_24 = 0; local_24 < iVar5; local_24 = local_24 + 1) {
          uVar3 = *(byte *)(local_8 + (local_28 + local_24)) + uVar3;
          uVar4 = uVar3 + uVar4;
        }
        uVar3 = uVar3 % 0xfff1;
        uVar4 = uVar4 % 0xfff1;
        local_28 = iVar5 + local_28;
        iVar5 = 0x15b0;
      }
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar4),iVar5,in_stack_ffffffffffffff88);
      }
      iVar6 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar6 + 1;
      local_38[iVar6] = (uchar)(uVar4 >> 8);
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar4),iVar5,in_stack_ffffffffffffff88);
      }
      iVar6 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar6 + 1;
      local_38[iVar6] = (uchar)uVar4;
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar4),iVar5,in_stack_ffffffffffffff88);
      }
      iVar6 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar6 + 1;
      local_38[iVar6] = (uchar)(uVar3 >> 8);
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar4),iVar5,in_stack_ffffffffffffff88);
      }
      iVar5 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar5 + 1;
      local_38[iVar5] = (uchar)uVar3;
      *local_18 = *(int *)(local_38 + -4);
      memmove(local_38 + -8,local_38,(long)*local_18);
      return local_38 + -8;
    }
    uVar3 = stbiw__zhash((uchar *)(local_8 + local_24));
    uVar3 = uVar3 & 0x3fff;
    local_48 = 3;
    local_50 = 0;
    lVar1 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    if (lVar1 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)(lVar1 + -4);
    }
    in_stack_ffffffffffffff88 = iVar5;
    for (local_28 = 0; local_28 < iVar5; local_28 = local_28 + 1) {
      if (((long)(local_24 + -0x8000) < *(long *)(lVar1 + (long)local_28 * 8) - local_8) &&
         (uVar4 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_28 * 8),
                                     (uchar *)(local_8 + local_24),local_c - local_24),
         (int)local_48 <= (int)uVar4)) {
        local_50 = *(long *)(lVar1 + (long)local_28 * 8);
        local_48 = uVar4;
      }
    }
    if ((*(long *)((long)__ptr + (long)(int)uVar3 * 8) != 0) &&
       (*(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) == local_1c * 2)) {
      memmove(*(void **)((long)__ptr + (long)(int)uVar3 * 8),
              (void *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + (long)local_1c * 8),
              (long)local_1c << 3);
      *(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) = local_1c;
    }
    if ((*(long *)((long)__ptr + (long)(int)uVar3 * 8) == 0) ||
       (*(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -8) <=
        *(int *)(*(long *)((long)__ptr + (long)(int)uVar3 * 8) + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
    lVar1 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    lVar2 = *(long *)((long)__ptr + (long)(int)uVar3 * 8);
    iVar5 = *(int *)(lVar2 + -4);
    *(int *)(lVar2 + -4) = iVar5 + 1;
    *(long *)(lVar1 + (long)iVar5 * 8) = local_8 + local_24;
    if (local_50 != 0) {
      uVar3 = stbiw__zhash((uchar *)(local_8 + local_24 + 1));
      lVar1 = *(long *)((long)__ptr + (long)(int)(uVar3 & 0x3fff) * 8);
      if (lVar1 == 0) {
        local_7c = 0;
      }
      else {
        local_7c = *(int *)(lVar1 + -4);
      }
      for (local_28 = 0; local_28 < local_7c; local_28 = local_28 + 1) {
        if (((long)(local_24 + -0x7fff) < *(long *)(lVar1 + (long)local_28 * 8) - local_8) &&
           (uVar3 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_28 * 8),
                                       (uchar *)(local_8 + local_24 + 1),(local_c - local_24) + -1),
           (int)local_48 < (int)uVar3)) {
          local_50 = 0;
          break;
        }
      }
    }
    if (local_50 == 0) {
      if (*(byte *)(local_8 + local_24) < 0x90) {
        iVar5 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x30,8);
        local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 8;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x138faa);
      }
      else {
        iVar5 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x100,9);
        local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 9;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x139005);
      }
      local_24 = local_24 + 1;
    }
    else {
      iVar5 = ((int)local_8 + local_24) - (int)local_50;
      if (0x7fff < iVar5 || 0x102 < (int)local_48) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image_write.h"
                      ,0x323,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      local_28 = 0;
      while ((int)(stbi_zlib_compress::lengthc[local_28 + 1] - 1) < (int)local_48) {
        local_28 = local_28 + 1;
      }
      if (local_28 + 0x101 < 0x90) {
        iVar6 = stbiw__zlib_bitrev(local_28 + 0x131,8);
        local_20 = iVar6 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 8;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x138ca0);
      }
      else if (local_28 + 0x101 < 0x100) {
        iVar6 = stbiw__zlib_bitrev(local_28 + 0x201,9);
        local_20 = iVar6 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 9;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x138d07);
      }
      else {
        if (local_28 + 0x101 < 0x118) {
          iVar6 = stbiw__zlib_bitrev(local_28 + 1,7);
          local_20 = iVar6 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 7;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                                        ,(int *)0x138d75);
        }
        else {
          iVar6 = stbiw__zlib_bitrev(local_28 + 0xa9,8);
          local_20 = iVar6 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 8;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                                        ,(int *)0x138dd3);
        }
        in_stack_ffffffffffffff70 = &local_38;
      }
      if (stbi_zlib_compress::lengtheb[local_28] != '\0') {
        local_20 = local_48 - stbi_zlib_compress::lengthc[local_28] << ((byte)local_2c & 0x1f) |
                   local_20;
        local_2c = (uint)stbi_zlib_compress::lengtheb[local_28] + local_2c;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x138e53);
      }
      local_28 = 0;
      while ((int)(stbi_zlib_compress::distc[local_28 + 1] - 1) < iVar5) {
        local_28 = local_28 + 1;
      }
      iVar6 = stbiw__zlib_bitrev(local_28,5);
      local_20 = iVar6 << ((byte)local_2c & 0x1f) | local_20;
      local_2c = local_2c + 5;
      local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                    (int *)0x138eca);
      if (stbi_zlib_compress::disteb[local_28] != '\0') {
        local_20 = iVar5 - (uint)stbi_zlib_compress::distc[local_28] << ((byte)local_2c & 0x1f) |
                   local_20;
        local_2c = (uint)stbi_zlib_compress::disteb[local_28] + local_2c;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                      (int *)0x138f31);
      }
      local_24 = local_48 + local_24;
    }
  } while( true );
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(char**));
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}